

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::UntypedMessage::Decode
          (UntypedMessage *this,CodedInputStream *stream,optional<int> current_group)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  bool bVar4;
  Field_Kind FVar5;
  int32_t field_number_00;
  uint *puVar6;
  int *piVar7;
  reference pvVar8;
  Field *pFVar9;
  Status *x_00;
  Message **ppMVar10;
  LogMessage *pLVar11;
  LogMessageFatal local_108 [18];
  Voidify local_f6;
  byte local_f5;
  optional<int> local_f4;
  byte local_e9;
  undefined1 local_e8 [8];
  UntypedMessage group;
  undefined1 local_b8 [8];
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> group_desc;
  uint32_t local_a0;
  uint32_t local_9c;
  uint32_t x_3;
  uint32_t x_2;
  uint64_t x_1;
  uint64_t x;
  Field *field;
  int32_t wire_type;
  int32_t field_number;
  uint local_64;
  undefined1 local_60 [4];
  uint32_t tag;
  vector<int,_std::allocator<int>_> group_stack;
  CodedInputStream *stream_local;
  UntypedMessage *this_local;
  optional<int> current_group_local;
  Status *_status;
  uint32_t local_1c;
  uint32_t v;
  uint local_c;
  
  group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)current_group.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>;
  current_group_local.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)this;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_60);
LAB_004feab0:
  do {
    while( true ) {
      piVar3 = group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      local_1c = 0;
      if ((*(ulong *)group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage <
           *(ulong *)(group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 2)) &&
         (local_1c = (uint32_t)
                     **(byte **)group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage, local_1c < 0x80)) {
        io::CodedInputStream::Advance
                  ((CodedInputStream *)
                   group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,1);
        local_c = local_1c;
      }
      else {
        local_c = io::CodedInputStream::ReadTagFallback
                            ((CodedInputStream *)
                             group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,local_1c);
      }
      piVar3[8] = local_c;
      local_64 = local_c;
      if (local_c == 0) {
        absl::lts_20240722::OkStatus();
        wire_type = 1;
        goto LAB_004ff53f;
      }
      field._4_4_ = local_c >> 3;
      field._0_4_ = local_c & 7;
      if (((uint)field == 4) &&
         (bVar4 = std::vector<int,_std::allocator<int>_>::empty
                            ((vector<int,_std::allocator<int>_> *)local_60), bVar4)) {
        bVar4 = std::optional<int>::has_value((optional<int> *)&this_local);
        uVar1 = field._4_4_;
        if (bVar4) {
          puVar6 = (uint *)std::optional<int>::operator*((optional<int> *)&this_local);
          uVar2 = field._4_4_;
          if (uVar1 == *puVar6) {
            absl::lts_20240722::OkStatus();
            wire_type = 1;
          }
          else {
            piVar7 = std::optional<int>::operator*((optional<int> *)&this_local);
            MakeEndGroupMismatchError((json_internal *)this,uVar2,*piVar7);
            wire_type = 1;
          }
        }
        else {
          MakeEndGroupWithoutGroupError((json_internal *)this,field._4_4_);
          wire_type = 1;
        }
        goto LAB_004ff53f;
      }
      x = (uint64_t)ResolverPool::Message::FindField((Message *)stream->buffer_,field._4_4_);
      bVar4 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)local_60);
      if ((bVar4) && (x != 0)) break;
      switch((uint)field) {
      case 0:
        bVar4 = io::CodedInputStream::ReadVarint64
                          ((CodedInputStream *)
                           group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,&x_1);
        if (!bVar4) {
          MakeUnexpectedEofError();
          wire_type = 1;
          goto LAB_004ff53f;
        }
        break;
      case 1:
        bVar4 = io::CodedInputStream::ReadLittleEndian64
                          ((CodedInputStream *)
                           group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(uint64_t *)&x_3);
        if (!bVar4) {
          MakeUnexpectedEofError();
          wire_type = 1;
          goto LAB_004ff53f;
        }
        break;
      case 2:
        bVar4 = io::CodedInputStream::ReadVarint32
                          ((CodedInputStream *)
                           group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,&local_a0);
        if (!bVar4) {
          MakeUnexpectedEofError();
          wire_type = 1;
          goto LAB_004ff53f;
        }
        io::CodedInputStream::Skip
                  ((CodedInputStream *)
                   group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,local_a0);
        break;
      case 3:
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_60,
                   (value_type_conflict3 *)((long)&field + 4));
        break;
      case 4:
        bVar4 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)local_60);
        uVar1 = field._4_4_;
        if (bVar4) {
          MakeEndGroupWithoutGroupError((json_internal *)this,field._4_4_);
          wire_type = 1;
          goto LAB_004ff53f;
        }
        puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::back
                                   ((vector<int,_std::allocator<int>_> *)local_60);
        uVar2 = field._4_4_;
        if (uVar1 != *puVar6) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::back
                             ((vector<int,_std::allocator<int>_> *)local_60);
          MakeEndGroupMismatchError((json_internal *)this,uVar2,*pvVar8);
          wire_type = 1;
          goto LAB_004ff53f;
        }
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)local_60);
        break;
      case 5:
        bVar4 = io::CodedInputStream::ReadLittleEndian32
                          ((CodedInputStream *)
                           group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,&local_9c);
        if (!bVar4) {
          MakeUnexpectedEofError();
          wire_type = 1;
          goto LAB_004ff53f;
        }
        break;
      default:
        MakeUnknownWireTypeError((json_internal *)this,(uint)field);
        wire_type = 1;
        goto LAB_004ff53f;
      }
    }
    switch((uint)field) {
    case 0:
      group_desc.super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
      field_1._7_1_ = 0;
      DecodeVarint(this,stream,
                   (Field *)group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      bVar4 = absl::lts_20240722::Status::ok((Status *)this);
      bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
      if (bVar4) {
        group_desc.
        super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.field_1.
        _7_1_ = 1;
      }
      wire_type = (int32_t)bVar4;
      if ((group_desc.
           super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
           field_1._7_1_ & 1) == 0) {
        absl::lts_20240722::Status::~Status((Status *)this);
      }
      break;
    case 1:
      group_desc.super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
      field_1._6_1_ = 0;
      Decode64Bit(this,stream,
                  (Field *)group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      bVar4 = absl::lts_20240722::Status::ok((Status *)this);
      bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
      if (bVar4) {
        group_desc.
        super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.field_1.
        _6_1_ = 1;
      }
      wire_type = (int32_t)bVar4;
      if ((group_desc.
           super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
           field_1._6_1_ & 1) == 0) {
        absl::lts_20240722::Status::~Status((Status *)this);
      }
      break;
    case 2:
      group_desc.super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
      field_1._4_1_ = 0;
      DecodeDelimited(this,stream,
                      (Field *)group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
      bVar4 = absl::lts_20240722::Status::ok((Status *)this);
      bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
      if (bVar4) {
        group_desc.
        super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.field_1.
        _4_1_ = 1;
      }
      wire_type = (int32_t)bVar4;
      if ((group_desc.
           super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
           field_1._4_1_ & 1) == 0) {
        absl::lts_20240722::Status::~Status((Status *)this);
      }
      break;
    case 3:
      pFVar9 = ResolverPool::Field::proto((Field *)x);
      FVar5 = Field::kind(pFVar9);
      if (FVar5 == Field_Kind_TYPE_GROUP) goto LAB_004ff1da;
      pFVar9 = ResolverPool::Field::proto((Field *)x);
      field_number_00 = Field::number(pFVar9);
      MakeFieldNotGroupError((json_internal *)this,field_number_00);
      wire_type = 1;
      goto LAB_004ff53f;
    case 4:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_108,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/untyped_message.cc"
                 ,0x134);
      pLVar11 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                          ((LogMessage *)local_108);
      pLVar11 = absl::lts_20240722::log_internal::LogMessage::operator<<
                          (pLVar11,(char (*) [12])"unreachable");
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_f6,pLVar11);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_108);
    case 5:
      group_desc.super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
      field_1._5_1_ = 0;
      Decode32Bit(this,stream,
                  (Field *)group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      bVar4 = absl::lts_20240722::Status::ok((Status *)this);
      bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
      if (bVar4) {
        group_desc.
        super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.field_1.
        _5_1_ = 1;
      }
      wire_type = (int32_t)bVar4;
      if ((group_desc.
           super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
           field_1._5_1_ & 1) == 0) {
        absl::lts_20240722::Status::~Status((Status *)this);
      }
      break;
    default:
      MakeUnknownWireTypeError((json_internal *)this,(uint)field);
      wire_type = 1;
      goto LAB_004ff53f;
    }
  } while (wire_type == 0);
  goto LAB_004ff53f;
LAB_004ff1da:
  ResolverPool::Field::MessageType((Field *)local_b8);
  group.fields_.super_raw_hash_map<_2385b75b_>.super_raw_hash_set<_2385b75b_>.settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.soo_data[0xf] = '\0';
  x_00 = absl::lts_20240722::
         StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*>::status
                   ((StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                    local_b8);
  absl::lts_20240722::Status::Status((Status *)this,x_00);
  bVar4 = absl::lts_20240722::Status::ok((Status *)this);
  bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
  if (bVar4) {
    group.fields_.super_raw_hash_map<_2385b75b_>.super_raw_hash_set<_2385b75b_>.settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.soo_data[0xf] = '\x01';
  }
  wire_type = (int32_t)bVar4;
  if ((group.fields_.super_raw_hash_map<_2385b75b_>.super_raw_hash_set<_2385b75b_>.settings_.
       super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
       .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
       heap_or_soo_.soo_data[0xf] & 1) == 0) {
    absl::lts_20240722::Status::~Status((Status *)this);
  }
  if (wire_type == 0) {
    ppMVar10 = absl::lts_20240722::
               StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*>::operator*
                         ((StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*>
                           *)local_b8);
    UntypedMessage((UntypedMessage *)local_e8,*ppMVar10);
    piVar3 = group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    local_e9 = 0;
    std::optional<int>::optional<int_&,_true>(&local_f4,(int *)((long)&field + 4));
    Decode(this,(CodedInputStream *)local_e8,(optional<int>)piVar3);
    bVar4 = absl::lts_20240722::Status::ok((Status *)this);
    bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
    if (bVar4) {
      local_e9 = 1;
    }
    wire_type = (int32_t)bVar4;
    if ((local_e9 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (wire_type == 0) {
      local_f5 = 0;
      InsertField<google::protobuf::json_internal::UntypedMessage>
                (this,(Field *)stream,(UntypedMessage *)x);
      bVar4 = absl::lts_20240722::Status::ok((Status *)this);
      bVar4 = ((bVar4 ^ 0xffU) & 1) != 0;
      if (bVar4) {
        local_f5 = 1;
      }
      wire_type = (int32_t)bVar4;
      if ((local_f5 & 1) == 0) {
        absl::lts_20240722::Status::~Status((Status *)this);
      }
      if (wire_type == 0) {
        wire_type = 5;
      }
    }
    ~UntypedMessage((UntypedMessage *)local_e8);
  }
  absl::lts_20240722::StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*>::
  ~StatusOr((StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> *)local_b8);
  if (wire_type != 5) {
LAB_004ff53f:
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
    return (Status)(uintptr_t)this;
  }
  goto LAB_004feab0;
}

Assistant:

absl::Status UntypedMessage::Decode(io::CodedInputStream& stream,
                                    absl::optional<int32_t> current_group) {
  std::vector<int32_t> group_stack;
  while (true) {
    uint32_t tag = stream.ReadTag();
    if (tag == 0) {
      return absl::OkStatus();
    }

    int32_t field_number = tag >> 3;
    int32_t wire_type = tag & 7;

    // EGROUP markers can show up as "unknown fields", so we need to handle them
    // before we even do field lookup. Being inside of a group behaves as if a
    // special field has been added to the message.
    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP &&
        group_stack.empty()) {
      if (!current_group.has_value()) {
        return MakeEndGroupWithoutGroupError(field_number);
      }
      if (field_number != *current_group) {
        return MakeEndGroupMismatchError(field_number, *current_group);
      }
      return absl::OkStatus();
    }

    const auto* field = desc_->FindField(field_number);
    if (!group_stack.empty() || field == nullptr) {
      // Skip unknown field. If the group-stack is non-empty, we are in the
      // process of working through an unknown group.
      switch (wire_type) {
        case WireFormatLite::WIRETYPE_VARINT: {
          uint64_t x;
          if (!stream.ReadVarint64(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_FIXED64: {
          uint64_t x;
          if (!stream.ReadLittleEndian64(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_FIXED32: {
          uint32_t x;
          if (!stream.ReadLittleEndian32(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
          uint32_t x;
          if (!stream.ReadVarint32(&x)) {
            return MakeUnexpectedEofError();
          }
          stream.Skip(x);
          continue;
        }
        case WireFormatLite::WIRETYPE_START_GROUP: {
          group_stack.push_back(field_number);
          continue;
        }
        case WireFormatLite::WIRETYPE_END_GROUP: {
          if (group_stack.empty()) {
            return MakeEndGroupWithoutGroupError(field_number);
          }
          if (field_number != group_stack.back()) {
            return MakeEndGroupMismatchError(field_number, group_stack.back());
          }
          group_stack.pop_back();
          continue;
        }
        default:
          return MakeUnknownWireTypeError(wire_type);
      }
    }
    switch (wire_type) {
      case WireFormatLite::WIRETYPE_VARINT:
        RETURN_IF_ERROR(DecodeVarint(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_FIXED64:
        RETURN_IF_ERROR(Decode64Bit(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_FIXED32:
        RETURN_IF_ERROR(Decode32Bit(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_LENGTH_DELIMITED:
        RETURN_IF_ERROR(DecodeDelimited(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_START_GROUP: {
        if (field->proto().kind() != Field::TYPE_GROUP) {
          return MakeFieldNotGroupError(field->proto().number());
        }
        auto group_desc = field->MessageType();
        RETURN_IF_ERROR(group_desc.status());

        UntypedMessage group(*group_desc);
        RETURN_IF_ERROR(group.Decode(stream, field_number));
        RETURN_IF_ERROR(InsertField(*field, std::move(group)));
        break;
      }
      case WireFormatLite::WIRETYPE_END_GROUP:
        ABSL_LOG(FATAL) << "unreachable";
        break;
      default:
        return MakeUnknownWireTypeError(wire_type);
    }
  }

  return absl::OkStatus();
}